

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O2

rtosc_arg_val_t *
rtosc_arg_val_range_arg(rtosc_arg_val_t *range_arg,int ith,rtosc_arg_val_t *result)

{
  int iVar1;
  rtosc_arg_val_t *prVar2;
  rtosc_arg_val_t mult;
  rtosc_arg_val_t n_as_arg_val;
  rtosc_arg_val_t local_40;
  rtosc_arg_val_t local_28;
  
  iVar1 = rtosc_arg_val_from_int(&local_28,range_arg[1].type,ith);
  if ((iVar1 == 0) || (iVar1 = rtosc_arg_val_mult(&local_28,range_arg + 1,&local_40), iVar1 == 0)) {
    prVar2 = (rtosc_arg_val_t *)0x0;
  }
  else {
    iVar1 = rtosc_arg_val_add(range_arg + 2,&local_40,result);
    prVar2 = (rtosc_arg_val_t *)0x0;
    if (iVar1 != 0) {
      prVar2 = result;
    }
  }
  return prVar2;
}

Assistant:

rtosc_arg_val_t* rtosc_arg_val_range_arg(const rtosc_arg_val_t *range_arg,
                                         int ith, rtosc_arg_val_t* result)
{
    rtosc_arg_val_t n_as_arg_val, mult;
    int ok = 1;
    if(ok) ok = rtosc_arg_val_from_int(&n_as_arg_val, range_arg[1].type, ith);
    if(ok) ok = rtosc_arg_val_mult(&n_as_arg_val, range_arg+1, &mult);
    if(ok) ok = rtosc_arg_val_add(range_arg+2, &mult, result);
    return ok ? result : NULL;
}